

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O0

void __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,perior::quadratic<6ul,2ul>,perior::cubic_periodic_boundary<perior::point<double,2ul>>,perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::equal_to<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>
::
query_impl<perior::query::query_intersects_box<perior::point<double,2ul>>,std::back_insert_iterator<std::vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>>>
          (rtree<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,perior::quadratic<6ul,2ul>,perior::cubic_periodic_boundary<perior::point<double,2ul>>,perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::equal_to<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>
           *this,size_t node_idx,query_intersects_box<perior::point<double,_2UL>_> *q,
          back_insert_iterator<std::vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>_>
          out)

{
  size_type node_idx_00;
  bool bVar1;
  type_conflict tVar2;
  const_reference prVar3;
  reference puVar4;
  const_reference __value;
  back_insert_iterator<std::vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>_>
  *this_00;
  query_intersects_box<perior::point<double,_2UL>_> local_c0;
  size_type local_a0;
  size_t next;
  const_iterator e_1;
  const_iterator i_1;
  value_type *val;
  const_iterator e;
  const_iterator i;
  node_type *node;
  query_intersects_box<perior::point<double,_2UL>_> *q_local;
  size_t node_idx_local;
  rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  *this_local;
  back_insert_iterator<std::vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>_>
  out_local;
  
  this_local = (rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                *)out.container;
  prVar3 = boost::container::
           vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
           ::at((vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
                 *)(this + 0x50),node_idx);
  if ((prVar3->is_leaf & 1U) == 0) {
    boost::container::
    vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
    ::begin((vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
             *)&e_1);
    boost::container::
    vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
    ::end((vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
           *)&next);
    while (bVar1 = boost::container::operator!=(&e_1,(vec_iterator<unsigned_long_*,_true> *)&next),
          bVar1) {
      puVar4 = boost::container::vec_iterator<unsigned_long_*,_true>::operator*(&e_1);
      local_a0 = *puVar4;
      prVar3 = boost::container::
               vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
               ::at((vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
                     *)(this + 0x50),local_a0);
      tVar2 = intersects<perior::point<double,2ul>,perior::cubic_periodic_boundary>
                        (&q->rect,&prVar3->box,
                         (cubic_periodic_boundary<perior::point<double,_2UL>_> *)(this + 0x10));
      node_idx_00 = local_a0;
      if (tVar2) {
        query::query_intersects_box<perior::point<double,_2UL>_>::query_intersects_box(&local_c0,q);
        query_impl<perior::query::query_intersects_box<perior::point<double,2ul>>,std::back_insert_iterator<std::vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>>>
                  (this,node_idx_00,&local_c0,
                   (back_insert_iterator<std::vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>_>
                    )this_local);
      }
      boost::container::vec_iterator<unsigned_long_*,_true>::operator++(&e_1);
    }
  }
  else {
    boost::container::
    vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
    ::begin((vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
             *)&e);
    boost::container::
    vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
    ::end((vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
           *)&val);
    while (bVar1 = boost::container::operator!=(&e,(vec_iterator<unsigned_long_*,_true> *)&val),
          bVar1) {
      puVar4 = boost::container::vec_iterator<unsigned_long_*,_true>::operator*(&e);
      __value = boost::container::
                vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_void>
                ::at((vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_void>
                      *)(this + 0x68),*puVar4);
      out_local.container =
           (vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
            *)__value;
      tVar2 = intersects<perior::point<double,2ul>,perior::cubic_periodic_boundary>
                        (&__value->first,&q->rect,
                         (cubic_periodic_boundary<perior::point<double,_2UL>_> *)(this + 0x10));
      if (tVar2) {
        this_00 = std::
                  back_insert_iterator<std::vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>_>
                  ::operator*((back_insert_iterator<std::vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>_>
                               *)&this_local);
        std::
        back_insert_iterator<std::vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>_>
        ::operator=(this_00,__value);
        std::
        back_insert_iterator<std::vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>_>
        ::operator++((back_insert_iterator<std::vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>_>
                      *)&this_local);
      }
      boost::container::vec_iterator<unsigned_long_*,_true>::operator++(&e);
    }
  }
  return;
}

Assistant:

void query_impl(std::size_t node_idx, Query q, OutputIterator out) const
    {
        const node_type& node = tree_.at(node_idx);
        if(node.is_leaf)
        {
            for(typename node_type::const_iterator
                i(node.entry.begin()), e(node.entry.end()); i != e; ++i)
            {
                value_type const& val = container_.at(*i);
                if(q.match(indexable_getter_(val), this->boundary_) && q.match(val))
                {
                    *out = val;
                    ++out;
                }
            }
        }
        else
        {
            for(typename node_type::const_iterator
                i(node.entry.begin()), e(node.entry.end()); i != e; ++i)
            {
                const std::size_t next = *i;
                if(intersects(q.box(), tree_.at(next).box, this->boundary_))
                {
                    this->query_impl(next, q, out);
                }
            }
        }
        return;
    }